

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_deserialize_array_Test::~JsonParser_deserialize_array_Test
          (JsonParser_deserialize_array_Test *this)

{
  JsonParser_deserialize_array_Test *this_local;
  
  ~JsonParser_deserialize_array_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, deserialize_array) {
	json_parser parser;

	constexpr std::u8string_view json_data = u8R"json([
		true,
		false,
		1234,
		12.34,
		0.1234,
		"text"
	])json"sv;

	auto array = parser.deserialize(json_data).get<std::vector<object>>();
	ASSERT_EQ(array.size(), 6U);
	EXPECT_EQ(array[0], true);
	EXPECT_EQ(array[1], false);
	EXPECT_EQ(array[2], 1234);
	EXPECT_DOUBLE_EQ(array[3].get<double>(), 12.34);
	EXPECT_DOUBLE_EQ(array[4].get<double>(), 0.1234);
	EXPECT_EQ(array[5], u8"text");
}